

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O0

void __thiscall JsonTest::TestResult::TestResult(TestResult *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 1;
  std::deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>::deque
            ((deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_> *)0x13c852);
  std::__cxx11::string::string((string *)(in_RDI + 0x18));
  in_RDI[0x2c] = 0;
  *(undefined8 *)(in_RDI + 0x2e) = 0;
  in_RDI[0x20] = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined4 **)(in_RDI + 2) = in_RDI + 0x20;
  return;
}

Assistant:

TestResult::TestResult()
    : predicateId_(1), lastUsedPredicateId_(0), messageTarget_(0) {
  // The root predicate has id 0
  rootPredicateNode_.id_ = 0;
  rootPredicateNode_.next_ = 0;
  predicateStackTail_ = &rootPredicateNode_;
}